

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O0

Node * __thiscall AvlTree::insert(AvlTree *this,Node *node,int value)

{
  int iVar1;
  Node *pNVar2;
  int *piVar3;
  int local_2c;
  int balance;
  int local_24;
  Node *pNStack_20;
  int value_local;
  Node *node_local;
  AvlTree *this_local;
  
  local_24 = value;
  pNStack_20 = node;
  node_local = (Node *)this;
  if (node == (Node *)0x0) {
    this_local = (AvlTree *)newNode(this,value);
  }
  else {
    if (value < node->value) {
      pNVar2 = insert(this,node->leftChild,value);
      pNStack_20->leftChild = pNVar2;
    }
    else {
      if (value <= node->value) {
        return node;
      }
      pNVar2 = insert(this,node->rightChild,value);
      pNStack_20->rightChild = pNVar2;
    }
    balance = height(this,pNStack_20->leftChild);
    local_2c = height(this,pNStack_20->rightChild);
    piVar3 = std::max<int>(&balance,&local_2c);
    pNStack_20->height = *piVar3 + 1;
    iVar1 = getBalance(this,pNStack_20);
    if ((iVar1 < 2) || (pNStack_20->leftChild->value <= local_24)) {
      if ((iVar1 < -1) && (pNStack_20->rightChild->value < local_24)) {
        this_local = (AvlTree *)leftRotate(this,pNStack_20);
      }
      else if ((iVar1 < 2) || (local_24 <= pNStack_20->leftChild->value)) {
        if ((iVar1 < -1) && (local_24 < pNStack_20->rightChild->value)) {
          pNVar2 = rightRotate(this,pNStack_20->rightChild);
          pNStack_20->rightChild = pNVar2;
          this_local = (AvlTree *)leftRotate(this,pNStack_20);
        }
        else {
          this_local = (AvlTree *)pNStack_20;
        }
      }
      else {
        pNVar2 = leftRotate(this,pNStack_20->leftChild);
        pNStack_20->leftChild = pNVar2;
        this_local = (AvlTree *)rightRotate(this,pNStack_20);
      }
    }
    else {
      this_local = (AvlTree *)rightRotate(this,pNStack_20);
    }
  }
  return (Node *)this_local;
}

Assistant:

AvlTree::Node *AvlTree::insert(Node *node, int value) {
    /* 1.  Perform the normal BST insertion */
    if (node == nullptr) {
        return (newNode(value));
    }

    if (value < node->value) {
        node->leftChild = insert(node->leftChild, value);
    } else if (value > node->value) {
        node->rightChild = insert(node->rightChild, value);
    } else {// Equal values are not allowed in BST
        return node;
    }

    /* 2. Update height of this ancestor node */
    node->height = 1 + std::max(height(node->leftChild), height(node->rightChild));

    /* 3. Get the balance factor of this ancestor
          node to check whether this node became
          unbalanced */
    int balance = getBalance(node);

    // If this node becomes unbalanced, then
    // there are 4 cases

    // Left Left Case
    if (balance > 1 && value < node->leftChild->value) {
        return rightRotate(node);
    }

    // Right Right Case
    if (balance < -1 && value > node->rightChild->value) {
        return leftRotate(node);
    }

    // Left Right Case
    if (balance > 1 && value > node->leftChild->value) {
        node->leftChild = leftRotate(node->leftChild);
        return rightRotate(node);
    }

    // Right Left Case
    if (balance < -1 && value < node->rightChild->value) {
        node->rightChild = rightRotate(node->rightChild);
        return leftRotate(node);
    }

    /* return the (unchanged) node pointer */
    return node;
}